

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

value * mjs::string_replace(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                           string *str,value *search_value,value *replace_value)

{
  gc_heap_ptr_untyped *this;
  value *this_00;
  gc_heap *this_01;
  undefined4 uVar1;
  undefined8 uVar2;
  bool bVar3;
  void *pvVar4;
  regexp_object *prVar5;
  undefined8 *puVar6;
  uint *puVar7;
  size_type sVar8;
  long *plVar9;
  long *plVar10;
  ulong uVar11;
  gc_heap *pgVar12;
  ulong uVar13;
  value *v;
  double dVar14;
  undefined1 auVar15 [16];
  value match_1;
  wstring res;
  gc_heap_ptr<mjs::regexp_object> re;
  object_ptr o;
  object_ptr match;
  string search_string;
  value replace_val;
  undefined1 local_158 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_150;
  undefined1 local_130 [8];
  void *local_128;
  undefined1 local_120 [24];
  uint32_t local_108;
  gc_heap_ptr_untyped local_100;
  gc_heap_ptr_untyped local_f0;
  undefined1 local_e0 [16];
  value local_d0;
  allocation_context *local_a8;
  gc_heap_ptr_untyped local_a0;
  value *local_90;
  value *local_88;
  slot *local_80;
  gc_heap *local_78;
  gc_heap_ptr_untyped *local_70;
  wstring_view local_68;
  undefined1 local_58 [40];
  
  local_88 = search_value;
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  pgVar12 = *(gc_heap **)((long)pvVar4 + 8);
  value::value((value *)local_58,replace_value);
  if ((local_58._0_4_ != object) ||
     (bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                        ((gc_heap_ptr_untyped *)(local_58 + 8)), !bVar3)) {
    to_string((mjs *)(local_e0 + 0x10),pgVar12,(value *)local_58);
    local_158._0_4_ = 4;
    local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)CONCAT44(local_d0._4_4_,local_d0.type_);
    local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         local_d0.field_1._0_4_;
    if (local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
        (gc_heap *)0x0) {
      gc_heap::attach(local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_
                      ,(gc_heap_ptr_untyped *)((long)local_158 + 8));
    }
    value::operator=((value *)local_58,(value *)local_158);
    value::destroy((value *)local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e0 + 0x10));
  }
  v = local_88;
  if (local_88->type_ == object) {
    local_100.heap_ =
         (local_88->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_100.pos_ = *(uint32_t *)((long)&local_88->field_1 + 8);
    if ((slot *)local_100.heap_ != (slot *)0x0) {
      gc_heap::attach(local_100.heap_,&local_100);
    }
    bVar3 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>(&local_100);
    if (bVar3) {
      local_120._16_8_ = local_100.heap_;
      local_108 = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_120 + 0x10));
      }
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_120 + 0x10));
      uVar2 = local_120._16_8_;
      if ((*(byte *)((long)pvVar4 + 0x38) & 1) == 0) {
        prVar5 = (regexp_object *)
                 gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_120 + 0x10));
        regexp_object::exec((value *)local_158,prVar5,str);
        anon_unknown_35::do_replace
                  ((anon_unknown_35 *)(local_e0 + 0x10),str,(value *)local_158,(value *)local_58);
        __return_storage_ptr__->type_ = string;
        this_01 = (gc_heap *)CONCAT44(local_d0._4_4_,local_d0.type_);
        (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
        super_gc_heap_ptr_untyped.heap_ = this_01;
        *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_d0.field_1._0_4_;
        if (this_01 != (gc_heap *)0x0) {
          gc_heap::attach(this_01,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
        }
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e0 + 0x10));
        value::destroy((value *)local_158);
      }
      else {
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
        local_f0.heap_ = (gc_heap *)local_e0;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_f0,puVar7 + 1,puVar7 + (ulong)*puVar7 + 1);
        local_80 = (slot *)uVar2;
        local_90 = __return_storage_ptr__;
        local_78 = pgVar12;
        local_70 = &global->super_gc_heap_ptr_untyped;
        pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_120 + 0x10));
        value_representation::value_representation((value_representation *)local_158,0.0);
        *(undefined1 (*) [8])((long)pvVar4 + 0x30) = local_158;
        local_130 = (undefined1  [8])local_120;
        local_128 = (void *)0x0;
        local_120._0_4_ = 0;
        uVar13 = 0;
        this = (gc_heap_ptr_untyped *)(local_120 + 0x10);
        this_00 = (value *)(local_e0 + 0x10);
        do {
          prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(this);
          regexp_object::exec((value *)local_158,prVar5,str);
          uVar1 = local_158._0_4_;
          if (local_158._0_4_ != null) {
            if (local_158._0_4_ != object) {
              __assert_fail("match.type() == value_type::object",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                            ,0x181,
                            "string mjs::(anonymous namespace)::do_global_replace(const string &, const gc_heap_ptr<regexp_object> &, const value &)"
                           );
            }
            puVar6 = (undefined8 *)
                     gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)((long)local_158 + 8));
            local_68._M_len = 5;
            local_68._M_str = L"index";
            (**(code **)*puVar6)(this_00,puVar6,&local_68);
            if (local_d0.type_ != 3) {
              __assert_fail("type_ == value_type::number",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                            ,0x44,"double mjs::value::number_value() const");
            }
            value::destroy(this_00);
            puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
            uVar11 = uVar13 & 0xffffffff;
            if (*puVar7 < (uint)uVar13) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",uVar11);
            }
            std::__cxx11::wstring::append((wchar_t *)local_130,(ulong)(puVar7 + uVar11 + 1));
            anon_unknown_35::do_get_replacement_string
                      ((anon_unknown_35 *)this_00,str,(object_ptr *)((long)local_158 + 8),
                       (value *)local_58);
            pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
            std::__cxx11::wstring::append((wchar_t *)local_130,(long)pvVar4 + 4);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this_00);
            prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(this);
            local_a8 = (allocation_context *)regexp_object::last_index(prVar5);
            prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(this);
            dVar14 = regexp_object::last_index(prVar5);
            uVar13 = (ulong)(double)local_a8;
            if ((dVar14 == (double)uVar11) && (!NAN(dVar14) && !NAN((double)uVar11))) {
              pvVar4 = gc_heap_ptr_untyped::get(this);
              uVar13 = (ulong)((int)uVar13 + 1);
              value_representation::value_representation
                        ((value_representation *)this_00,(double)uVar13);
              *(ulong *)((long)pvVar4 + 0x30) = CONCAT44(local_d0._4_4_,local_d0.type_);
            }
          }
          value::destroy((value *)local_158);
          global = (gc_heap_ptr<mjs::global_object> *)local_70;
          pgVar12 = local_78;
          v = local_88;
          __return_storage_ptr__ = local_90;
        } while (uVar1 != null);
        if ((int)uVar13 == 0) {
          local_a0.heap_ = (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
          local_a0.pos_ = (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
          if (local_a0.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_a0.heap_,&local_a0);
          }
        }
        else {
          if ((uVar13 & 0xffffffff) < CONCAT44(local_f0._12_4_,local_f0.pos_)) {
            std::__cxx11::wstring::substr((ulong)local_158,(ulong)&local_f0);
            std::__cxx11::wstring::_M_append((wchar_t *)local_130,(ulong)local_158);
            if (local_158 != (undefined1  [8])((long)local_158 + 0x10U)) {
              operator_delete((void *)local_158,
                              CONCAT44(local_150._12_4_,
                                       local_150.s_.super_gc_heap_ptr<mjs::gc_string>.
                                       super_gc_heap_ptr_untyped.pos_) * 4 + 4);
            }
          }
          local_158 = (undefined1  [8])local_128;
          local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_130;
          string::string((string *)&local_a0,(gc_heap *)&local_80->allocation,
                         (wstring_view *)local_158);
          __return_storage_ptr__ = local_90;
        }
        if (local_130 != (undefined1  [8])local_120) {
          operator_delete((void *)local_130,CONCAT44(local_120._4_4_,local_120._0_4_) * 4 + 4);
        }
        if (local_f0.heap_ != (gc_heap *)local_e0) {
          operator_delete(local_f0.heap_,local_e0._0_8_ * 4 + 4);
        }
        __return_storage_ptr__->type_ = string;
        (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
        super_gc_heap_ptr_untyped.heap_ = local_a0.heap_;
        *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_a0.pos_;
        if (local_a0.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_a0.heap_,
                          (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
        }
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
      if (bVar3) goto LAB_0015c8cb;
    }
    else {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    }
  }
  to_string((mjs *)(local_e0 + 0x10),pgVar12,v);
  puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
  local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)(puVar7 + 1);
  local_158 = (undefined1  [8])(ulong)*puVar7;
  puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_e0 + 0x10));
  sVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::find
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_158,
                     (wchar_t *)(puVar7 + 1),0,(ulong)*puVar7);
  if (sVar8 == 0xffffffffffffffff) {
    __return_storage_ptr__->type_ = string;
    pgVar12 = (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = pgVar12;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) =
         (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    if (pgVar12 != (gc_heap *)0x0) {
      gc_heap::attach(pgVar12,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
  }
  else {
    make_array((gc_heap_ptr<mjs::global_object> *)&local_f0,(uint32_t)global);
    plVar9 = (long *)gc_heap_ptr_untyped::get(&local_f0);
    local_68._M_len = 1;
    local_68._M_str = L"0";
    string::string((string *)local_130,pgVar12,&local_68);
    local_158._0_4_ = string;
    local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         local_d0.field_1._0_4_;
    if ((gc_heap *)CONCAT44(local_d0._4_4_,local_d0.type_) != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)CONCAT44(local_d0._4_4_,local_d0.type_),
                      (gc_heap_ptr_untyped *)((long)local_158 + 8));
    }
    (**(code **)(*plVar9 + 8))(plVar9,local_130,local_158,0);
    value::destroy((value *)local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_130);
    plVar9 = (long *)gc_heap_ptr_untyped::get(&local_f0);
    plVar10 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar10 + 0x98))(local_130,plVar10,"index");
    auVar15._8_4_ = (int)(sVar8 >> 0x20);
    auVar15._0_8_ = sVar8;
    auVar15._12_4_ = 0x45300000;
    local_150.n_ = (auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0);
    local_158._0_4_ = number;
    (**(code **)(*plVar9 + 8))(plVar9,local_130,local_158,0);
    value::destroy((value *)local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_130);
    local_158._0_4_ = 5;
    local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_f0.heap_;
    local_150.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0.pos_;
    if (local_f0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_f0.heap_,(gc_heap_ptr_untyped *)((long)local_158 + 8));
    }
    anon_unknown_35::do_replace
              ((anon_unknown_35 *)local_130,str,(value *)local_158,(value *)local_58);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = (gc_heap *)local_130;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = (uint32_t)local_128;
    if (local_130 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_130,
                      (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_130);
    value::destroy((value *)local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f0);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e0 + 0x10));
LAB_0015c8cb:
  value::destroy((value *)local_58);
  return __return_storage_ptr__;
}

Assistant:

value string_replace(const gc_heap_ptr<global_object>& global, const string& str, const value& search_value, const value& replace_value) {
    auto& h = global->heap();

    value replace_val = replace_value;
    if (replace_val.type() != value_type::object || !replace_val.object_value().has_type<function_object>()) {
        replace_val = value{to_string(h, replace_val)};
    }

    if (search_value.type() == value_type::object) {
        auto o = search_value.object_value();
        if (o.has_type<regexp_object>()) {
            gc_heap_ptr<regexp_object> re{o};
            if ((re->flags() & regexp_flag::global) == regexp_flag::none) {
                auto match = re->exec(str);
                return value{do_replace(str, match, replace_val)};
            }
            return value{do_global_replace(str, re, replace_val)};
        }
    }

    auto search_string = to_string(h, search_value);
    auto idx = str.view().find(search_string.view());
    if (idx == std::wstring_view::npos) {
        return value{str};
    }
    // Fake up a match object
    auto match = make_array(global, 0);
    match->put(string{h, L"0"}, value{search_string});
    match->put(global->common_string("index"), value{static_cast<double>(idx)});

    return value{do_replace(str, value{match}, replace_val)};
}